

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O0

bool __thiscall
EOPlus::Context::TriggerRule
          (Context *this,string *rule,
          function<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&)>
          *arg_check)

{
  bool bVar1;
  __type _Var2;
  deque<EOPlus::Rule,_std::allocator<EOPlus::Rule>_> *this_00;
  reference pRVar3;
  undefined1 local_2b8 [8];
  Rule check_rule;
  const_iterator __end1;
  const_iterator __begin1;
  deque<EOPlus::Rule,_std::allocator<EOPlus::Rule>_> *__range1;
  function<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&)>
  *arg_check_local;
  string *rule_local;
  Context *this_local;
  
  if (this->state == (State *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    this_00 = &this->state->rules;
    std::deque<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>::begin
              ((const_iterator *)&__end1._M_node,this_00);
    std::deque<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>::end
              ((const_iterator *)
               &check_rule.action.expr.args.
                super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node,this_00);
    while (bVar1 = std::operator!=((_Self *)&__end1._M_node,
                                   (_Self *)&check_rule.action.expr.args.
                                             super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                             ._M_impl.super__Deque_impl_data._M_finish._M_node),
          bVar1) {
      pRVar3 = std::_Deque_iterator<EOPlus::Rule,_const_EOPlus::Rule_&,_const_EOPlus::Rule_*>::
               operator*((_Deque_iterator<EOPlus::Rule,_const_EOPlus::Rule_&,_const_EOPlus::Rule_*>
                          *)&__end1._M_node);
      Rule::Rule((Rule *)local_2b8,pRVar3);
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &check_rule.expr.scopes.
                               super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
                               _M_impl.super__Deque_impl_data._M_finish._M_node,rule);
      if ((_Var2) &&
         (bVar1 = std::
                  function<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&)>
                  ::operator()(arg_check,
                               (deque<util::variant,_std::allocator<util::variant>_> *)
                               ((long)&check_rule.expr.function.field_2 + 8)), bVar1)) {
        (*this->_vptr_Context[1])
                  (this,&check_rule.expr.args.
                         super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_node);
        this_local._7_1_ = 1;
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
      Rule::~Rule((Rule *)local_2b8);
      if (bVar1) goto LAB_0016daa0;
      std::_Deque_iterator<EOPlus::Rule,_const_EOPlus::Rule_&,_const_EOPlus::Rule_*>::operator++
                ((_Deque_iterator<EOPlus::Rule,_const_EOPlus::Rule_&,_const_EOPlus::Rule_*> *)
                 &__end1._M_node);
    }
    this_local._7_1_ = 0;
  }
LAB_0016daa0:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Context::TriggerRule(std::string rule, std::function<bool(const std::deque<util::variant>&)> arg_check)
	{
		if (!this->state)
			return false;

		UTIL_FOREACH(this->state->rules, check_rule)
		{
			if (check_rule.expr.function == rule && arg_check(check_rule.expr.args))
			{
				this->DoAction(check_rule.action);
				// *this may not be valid here
				return true;
			}
		}

		return false;
	}